

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KRef_Ptr.h
# Opt level: O2

void __thiscall KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>::unRef(KRef_Ptr<KDIS::PDU::Header7> *this)

{
  RefCounter *pRVar1;
  Header7 *pHVar2;
  
  if (this->m_pRef != (Header7 *)0x0) {
    pRVar1 = this->m_piCount;
    *pRVar1 = *pRVar1 - 1;
    if (*pRVar1 == 0) {
      operator_delete(pRVar1,2);
      pHVar2 = this->m_pRef;
      if (pHVar2 != (Header7 *)0x0) {
        (*(pHVar2->super_Header6)._vptr_Header6[1])();
      }
      this->m_pRef = (Header7 *)0x0;
      this->m_piCount = (RefCounter *)0x0;
    }
  }
  return;
}

Assistant:

void unRef()
    {
        if( m_pRef )
        {
            --( *m_piCount );
            if( *m_piCount == 0 )
            {
                delete m_piCount;
                delete m_pRef;
                m_piCount = NULL;
                m_pRef = NULL;
            }
        }
    }